

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void * argtable3_xcalloc(size_t count,size_t size)

{
  void *pvVar1;
  
  if (count == 0 || size == 0) {
    count = 1;
    size = 1;
  }
  pvVar1 = calloc(count,size);
  if (pvVar1 == (void *)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  return pvVar1;
}

Assistant:

void* xcalloc(size_t count, size_t size) {
    size_t allocated_count = count && size ? count : 1;
    size_t allocated_size = count && size ? size : 1;
    void* ret = calloc(allocated_count, allocated_size);
    if (!ret) {
        s_panic("Out of memory!\n");
    }
    return ret;
}